

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_functionActivationEnvironment_create
          (sysbvm_context_t *context,sysbvm_tuple_t parent,sysbvm_tuple_t function)

{
  long lVar1;
  undefined8 uVar2;
  uint uVar3;
  sysbvm_object_tuple_t *psVar4;
  ulong uVar5;
  sysbvm_tuple_t sVar6;
  ulong uVar7;
  
  if ((((function & 0xf) == 0 && function != 0) &&
      (uVar5 = *(ulong *)function, (uVar5 & 0xf) == 0 && uVar5 != 0)) &&
     ((*(byte *)(uVar5 + 8) & 0x80) == 0)) {
    uVar5 = *(ulong *)(uVar5 + 0x70);
    if (uVar5 == 0 || (uVar5 & 0xf) != 0) {
      uVar3 = (uint)((long)uVar5 >> 4);
    }
    else {
      uVar3 = (uint)*(undefined8 *)(uVar5 + 0x10);
    }
    if ((uVar3 >> 0xc & 1) != 0) {
      if (*(long *)(function + 0x48) == 0) {
        sysbvm_error("Expected a function with a definition.");
      }
      lVar1 = *(long *)(*(long *)(function + 0x48) + 0x78);
      if (lVar1 == 0) {
        sysbvm_error("Expected an analyzed source definition");
      }
      psVar4 = sysbvm_context_allocatePointerTuple
                         (context,(context->roots).functionActivationEnvironmentType,0x13);
      psVar4[2].header.field_0.typePointer = parent;
      psVar4[5].header.field_0.typePointer = function;
      uVar2 = *(undefined8 *)(function + 0x48);
      psVar4[5].header.identityHashAndFlags = (int)uVar2;
      psVar4[5].header.objectSize = (int)((ulong)uVar2 >> 0x20);
      uVar2 = *(undefined8 *)(function + 0x38);
      psVar4[6].header.identityHashAndFlags = (int)uVar2;
      psVar4[6].header.objectSize = (int)((ulong)uVar2 >> 0x20);
      uVar5 = *(ulong *)(lVar1 + 0x28);
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        uVar5 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
      }
      else {
        uVar5 = 0;
      }
      uVar7 = *(ulong *)(lVar1 + 0x30);
      if ((uVar7 & 0xf) == 0 && uVar7 != 0) {
        uVar7 = (ulong)(*(uint *)(uVar7 + 0xc) >> 3);
      }
      else {
        uVar7 = 0;
      }
      psVar4[6].header.field_0.typePointer = uVar5 << 4 | 0xb;
      sVar6 = sysbvm_array_create(context,uVar7 + uVar5);
      psVar4[6].field_1.pointers[0] = sVar6;
      return (sysbvm_tuple_t)psVar4;
    }
  }
  sysbvm_error("Expected a function");
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionActivationEnvironment_create(sysbvm_context_t *context, sysbvm_tuple_t parent, sysbvm_tuple_t function)
{
    if(!function || !sysbvm_tuple_isFunction(context, function))
        sysbvm_error("Expected a function");

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    if(!functionObject->definition)
        sysbvm_error("Expected a function with a definition.");

    sysbvm_functionDefinition_t *functionDefinitionObject = (sysbvm_functionDefinition_t*)functionObject->definition;
    if(!functionDefinitionObject->sourceAnalyzedDefinition)
        sysbvm_error("Expected an analyzed source definition");

    sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinitionObject->sourceAnalyzedDefinition;

    sysbvm_functionActivationEnvironment_t *result = (sysbvm_functionActivationEnvironment_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionActivationEnvironmentType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionActivationEnvironment_t));
    result->super.super.parent = parent;
    result->function = function;
    result->functionDefinition = functionObject->definition;
    result->captureVector = functionObject->captureVector;
    
    size_t argumentCount = sysbvm_array_getSize(sourceAnalyzedDefinition->arguments);
    size_t localCount = sysbvm_array_getSize(sourceAnalyzedDefinition->locals);
    result->argumentVectorSize = sysbvm_tuple_size_encode(context, argumentCount);
    result->valueVector = sysbvm_array_create(context, argumentCount + localCount);
    return (sysbvm_tuple_t)result;
}